

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O3

void R_InitColormaps(void)

{
  FakeCmap *pFVar1;
  byte bVar2;
  BYTE BVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  BYTE *pBVar11;
  int iVar12;
  ulong uVar13;
  size_t sVar14;
  int c;
  BYTE (*paBVar15) [256];
  int m;
  ulong uVar16;
  BYTE *pBVar17;
  bool bVar18;
  FakeCmap cm;
  FWadLump lump;
  char name [9];
  BYTE remap [256];
  BYTE mapin [256];
  char local_390;
  undefined7 uStack_38f;
  undefined4 uStack_388;
  int iStack_384;
  ulong local_380;
  long local_378;
  FWadLump local_370;
  byte local_338 [256];
  byte local_238 [256];
  byte local_138 [264];
  
  R_DeinitColormaps();
  local_390 = '\0';
  uStack_388 = 0;
  TArray<FakeCmap,_FakeCmap>::Grow(&fakecmaps,1);
  pFVar1 = fakecmaps.Array + fakecmaps.Count;
  *(ulong *)pFVar1->name = CONCAT71(uStack_38f,local_390);
  pFVar1->blend = (PalEntry)uStack_388;
  pFVar1->lump = iStack_384;
  fakecmaps.Count = fakecmaps.Count + 1;
  iVar4 = FWadCollection::GetNumLumps(&Wads);
  if (iVar4 != 0) {
    iVar12 = 0;
    do {
      iVar5 = FWadCollection::GetLumpNamespace(&Wads,iVar12);
      if (iVar5 == 3) {
        local_338[8] = 0;
        FWadCollection::GetLumpName(&Wads,(char *)local_338,iVar12);
        iVar5 = FWadCollection::CheckNumForName(&Wads,(char *)local_338,3);
        if (iVar12 == iVar5) {
          strncpy(&local_390,(char *)local_338,8);
          uStack_388 = 0;
          iStack_384 = iVar12;
          TArray<FakeCmap,_FakeCmap>::Grow(&fakecmaps,1);
          pFVar1 = fakecmaps.Array + fakecmaps.Count;
          *(ulong *)pFVar1->name = CONCAT71(uStack_38f,local_390);
          pFVar1->blend = (PalEntry)uStack_388;
          pFVar1->lump = iStack_384;
          fakecmaps.Count = fakecmaps.Count + 1;
        }
      }
      iVar12 = iVar12 + 1;
    } while (iVar4 != iVar12);
  }
  realcolormaps = (BYTE *)operator_new__((ulong)(fakecmaps.Count << 0xd));
  R_SetDefaultColormap("COLORMAP");
  sVar14 = (size_t)fakecmaps.Count;
  if (1 < fakecmaps.Count) {
    memcpy(local_238,GPalette.Remap,0x100);
    lVar10 = 0;
    memset(local_338,0,0x100);
    do {
      local_338[local_238[lVar10]] = (byte)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x100);
    local_238[0] = 0;
    uVar13 = 1;
    do {
      iVar4 = FWadCollection::LumpLength(&Wads,fakecmaps.Array[uVar13].lump);
      if (0x20ff < iVar4) {
        uVar16 = (ulong)(uint)((int)uVar13 << 0xd);
        local_378 = uVar13 * 0x10;
        FWadCollection::OpenLumpNum(&local_370,&Wads,fakecmaps.Array[uVar13].lump);
        pBVar11 = realcolormaps;
        pBVar17 = realcolormaps + uVar16;
        lVar10 = 0;
        local_380 = uVar16;
        do {
          FWadLump::Read(&local_370,local_138,0x100);
          pBVar11[lVar10 * 0x100 + (ulong)(uint)((int)uVar13 << 0xd)] = '\0';
          lVar7 = 1;
          do {
            pBVar17[lVar7] = local_238[local_138[local_338[lVar7]]];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x100);
          lVar10 = lVar10 + 1;
          pBVar17 = pBVar17 + 0x100;
        } while (lVar10 != 0x20);
        lVar10 = 0;
        uVar6 = 0;
        uVar8 = 0;
        uVar9 = 0;
        do {
          bVar2 = pBVar11[lVar10 + local_380];
          uVar6 = uVar6 + GPalette.BaseColors[bVar2].field_0.field_0.r;
          uVar8 = uVar8 + GPalette.BaseColors[bVar2].field_0.field_0.g;
          uVar9 = uVar9 + GPalette.BaseColors[bVar2].field_0.field_0.b;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x100);
        *(uint *)((fakecmaps.Array)->name + local_378 + 8) =
             (uVar6 & 0xff00) * 0x100 + (uVar9 >> 8 & 0xff | uVar8 & 0xff00) + -0x1000000;
        FWadLump::~FWadLump(&local_370);
      }
      uVar13 = uVar13 + 1;
      sVar14 = (size_t)fakecmaps.Count;
    } while (uVar13 < sVar14);
  }
  pBVar11 = realcolormaps;
  pBVar17 = realfbcolormaps;
  if (realfbcolormaps == (BYTE *)0x0) {
    uVar13 = (ulong)(uint)((int)sVar14 << 0xd);
    pBVar17 = (BYTE *)operator_new__(uVar13);
    pBVar11 = realcolormaps;
    realfbcolormaps = pBVar17;
    memcpy(pBVar17,realcolormaps,uVar13);
  }
  NormalLight.Color.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0xffffff;
  NormalLight.Fade.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
  FullNormalLight.Color.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0xffffff;
  FullNormalLight.Fade.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
  lVar10 = 0;
  NormalLight.Maps = pBVar11;
  FullNormalLight.Maps = pBVar17;
  memset(local_338,0,0x100);
  do {
    local_338[pBVar11[lVar10 + 0x1f00]] = local_338[pBVar11[lVar10 + 0x1f00]] + 1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x100);
  lVar10 = 0xff;
  pBVar17 = pBVar11;
  do {
    if (local_338[pBVar11[lVar10 + 0x1f00]] < 0xb) {
      lVar7 = 0xff;
      while (pBVar17[lVar7] == pBVar11[lVar10 + 0x1f00]) {
        lVar7 = lVar7 + 0x100;
        if (lVar7 == 0x1fff) {
          NormalLightHasFixedLights = true;
          goto LAB_0033240e;
        }
      }
    }
    pBVar17 = pBVar17 + -1;
    bVar18 = lVar10 != 0;
    lVar10 = lVar10 + -1;
  } while (bVar18);
  NormalLightHasFixedLights = false;
LAB_0033240e:
  lVar10 = 0;
  numfakecmaps = sVar14;
  do {
    AddSpecialColormap(*(float *)((long)SpecialColormapParms[0].Start + lVar10),
                       *(float *)((long)SpecialColormapParms[0].Start + lVar10 + 4),
                       *(float *)((long)SpecialColormapParms[0].Start + lVar10 + 8),
                       *(float *)((long)SpecialColormapParms[0].End + lVar10),
                       *(float *)((long)SpecialColormapParms[0].End + lVar10 + 4),
                       *(float *)((long)SpecialColormapParms[0].End + lVar10 + 8));
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x78);
  paBVar15 = DesaturateColormap;
  lVar10 = 0;
  do {
    iVar4 = 0x1f - (int)lVar10;
    lVar7 = 0;
    do {
      uVar9 = (uint)GPalette.BaseColors[lVar7].field_0.field_0.r;
      uVar8 = (uint)GPalette.BaseColors[lVar7].field_0.field_0.g;
      uVar6 = (uint)GPalette.BaseColors[lVar7].field_0.field_0.b;
      iVar12 = (uVar6 * 0x25 + uVar8 * 0x8f + uVar9 * 0x4d >> 8) * (int)lVar10;
      BVar3 = FColorMatcher::Pick(&ColorMatcher,(uVar9 * iVar4 + iVar12) / 0x1f,
                                  (uVar8 * iVar4 + iVar12) / 0x1f,(uVar6 * iVar4 + iVar12) / 0x1f);
      (*paBVar15)[lVar7] = BVar3;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x100);
    lVar10 = lVar10 + 1;
    paBVar15 = paBVar15 + 1;
  } while (lVar10 != 0x1f);
  return;
}

Assistant:

void R_InitColormaps ()
{
	// [RH] Try and convert BOOM colormaps into blending values.
	//		This is a really rough hack, but it's better than
	//		not doing anything with them at all (right?)

	FakeCmap cm;

	R_DeinitColormaps();

	cm.name[0] = 0;
	cm.blend = 0;
	fakecmaps.Push(cm);

	DWORD NumLumps = Wads.GetNumLumps();

	for (DWORD i = 0; i < NumLumps; i++)
	{
		if (Wads.GetLumpNamespace(i) == ns_colormaps)
		{
			char name[9];
			name[8] = 0;
			Wads.GetLumpName (name, i);

			if (Wads.CheckNumForName (name, ns_colormaps) == (int)i)
			{
				strncpy(cm.name, name, 8);
				cm.blend = 0;
				cm.lump = i;
				fakecmaps.Push(cm);
			}
		}
	}
	realcolormaps = new BYTE[256*NUMCOLORMAPS*fakecmaps.Size()];
	R_SetDefaultColormap ("COLORMAP");

	if (fakecmaps.Size() > 1)
	{
		BYTE unremap[256], remap[256], mapin[256];
		int i;
		unsigned j;

		memcpy (remap, GPalette.Remap, 256);
		memset (unremap, 0, 256);
		for (i = 0; i < 256; ++i)
		{
			unremap[remap[i]] = i;
		}
		remap[0] = 0;
		for (j = 1; j < fakecmaps.Size(); j++)
		{
			if (Wads.LumpLength (fakecmaps[j].lump) >= (NUMCOLORMAPS+1)*256)
			{
				int k, r, g, b;
				FWadLump lump = Wads.OpenLumpNum (fakecmaps[j].lump);
				BYTE *const map = realcolormaps + NUMCOLORMAPS*256*j;

				for (k = 0; k < NUMCOLORMAPS; ++k)
				{
					BYTE *map2 = &map[k*256];
					lump.Read (mapin, 256);
					map2[0] = 0;
					for (r = 1; r < 256; ++r)
					{
						map2[r] = remap[mapin[unremap[r]]];
					}
				}

				r = g = b = 0;

				for (k = 0; k < 256; k++)
				{
					r += GPalette.BaseColors[map[k]].r;
					g += GPalette.BaseColors[map[k]].g;
					b += GPalette.BaseColors[map[k]].b;
				}
				fakecmaps[j].blend = PalEntry (255, r/256, g/256, b/256);
			}
		}
	}

	// [SP] Create a copy of the colormap
	if (!realfbcolormaps)
	{
		realfbcolormaps = new BYTE[256*NUMCOLORMAPS*fakecmaps.Size()];
		memcpy(realfbcolormaps, realcolormaps, 256*NUMCOLORMAPS*fakecmaps.Size());
	}

	NormalLight.Color = PalEntry (255, 255, 255);
	NormalLight.Fade = 0;
	NormalLight.Maps = realcolormaps;
	FullNormalLight.Color = PalEntry (255, 255, 255);
	FullNormalLight.Fade = 0;
	FullNormalLight.Maps = realfbcolormaps;
	NormalLightHasFixedLights = R_CheckForFixedLights(realcolormaps);
	numfakecmaps = fakecmaps.Size();

	// build default special maps (e.g. invulnerability)

	for (unsigned i = 0; i < countof(SpecialColormapParms); ++i)
	{
		AddSpecialColormap(SpecialColormapParms[i].Start[0], SpecialColormapParms[i].Start[1],
			SpecialColormapParms[i].Start[2], SpecialColormapParms[i].End[0],
			SpecialColormapParms[i].End[1], SpecialColormapParms[i].End[2]);
	}
	// desaturated colormaps. These are used for texture composition
	for(int m = 0; m < 31; m++)
	{
		BYTE *shade = DesaturateColormap[m];
		for (int c = 0; c < 256; c++)
		{
			int intensity = (GPalette.BaseColors[c].r * 77 +
						GPalette.BaseColors[c].g * 143 +
						GPalette.BaseColors[c].b * 37) / 256;

			int r = (GPalette.BaseColors[c].r * (31-m) + intensity *m) / 31;
			int g = (GPalette.BaseColors[c].g * (31-m) + intensity *m) / 31;
			int b = (GPalette.BaseColors[c].b * (31-m) + intensity *m) / 31;
			shade[c] = ColorMatcher.Pick(r, g, b);
		}
	}
}